

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

ostream * gl4cts::anon_unknown_0::operator<<(ostream *stream,imageStoreCall *store)

{
  char *pcVar1;
  
  std::operator<<(stream,"imageStore(");
  ImageLoadStoreMultipleUniformsTest::writeImageUniformNameToStream(stream,store->m_index);
  std::operator<<(stream,", ");
  ImageLoadStoreMultipleUniformsTest::writeCoordinatesVariableNameToStream
            (stream,store->m_index,store->m_row);
  pcVar1 = ", -";
  if (store->m_row != 0) {
    pcVar1 = ", ";
  }
  std::operator<<(stream,pcVar1);
  ImageLoadStoreMultipleUniformsTest::writeLoadedValueVariableNameToStream(stream,store->m_index);
  std::operator<<(stream,");");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const imageStoreCall& store)
	{
		/* imageStore(u_image_0, row_0_coordinates_0, -loaded_value_0); */
		stream << "imageStore(";

		writeImageUniformNameToStream(stream, store.m_index);

		stream << ", ";

		writeCoordinatesVariableNameToStream(stream, store.m_index, store.m_row);

		if (0 == store.m_row)
		{
			stream << ", -";
		}
		else
		{
			stream << ", ";
		}

		writeLoadedValueVariableNameToStream(stream, store.m_index);
		stream << ");";

		return stream;
	}